

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

uint32 __thiscall Js::DiagScopeVariablesWalker::GetChildrenCount(DiagScopeVariablesWalker *this)

{
  RecyclableArrayWalker *this_00;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int offset;
  int iVar5;
  RegSlot RVar6;
  int iVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  FunctionBody *this_01;
  ScopeObjectChain *pSVar9;
  undefined4 extraout_var_00;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar10;
  Type *pTVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RecyclableObjectWalker *pRVar12;
  undefined4 extraout_var_03;
  undefined **ppuVar13;
  _func_int **pp_Var14;
  DiagStackFrame *pDVar15;
  DiagScopeVariablesWalker *pDVar16;
  undefined **local_70;
  RecyclableObjectWalker *local_40;
  DiagScopeVariablesWalker *local_38;
  
  local_38 = this;
  if (this->scopeIsInitialized == false) {
    pDVar15 = (this->super_VariableWalkerBase).pFrame;
    if (pDVar15 == (DiagStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x3ac,"(pFrame)","pFrame");
      if (!bVar3) {
LAB_007e8871:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pDVar15 = (local_38->super_VariableWalkerBase).pFrame;
    }
    iVar4 = (*pDVar15->_vptr_DiagStackFrame[2])();
    this_01 = JavascriptFunction::GetFunctionBody
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar4));
    pSVar9 = FunctionBody::GetScopeObjectChain(this_01);
    pDVar16 = local_38;
    if (pSVar9 != (ScopeObjectChain *)0x0) {
      offset = VariableWalkerBase::GetAdjustedByteCodeOffset(&local_38->super_VariableWalkerBase);
      iVar5 = (*((pDVar16->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
      alloc = GetArenaFromContext((ScriptContext *)CONCAT44(extraout_var_00,iVar5));
      pLVar10 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::New(alloc,4);
      pDVar16->pDiagScopeObjects = pLVar10;
      pSVar9 = FunctionBody::GetScopeObjectChain(this_01);
      iVar4 = (((pSVar9->pScopeChain).ptr)->
              super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      local_70 = &PTR_Get_0137fa00;
LAB_007e8595:
      iVar4 = iVar4 + -1;
      if (-1 < iVar4) {
        pTVar11 = JsUtil::
                  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((pSVar9->pScopeChain).ptr,iVar4);
        this_00 = (RecyclableArrayWalker *)pTVar11->ptr;
        bVar3 = DebuggerScope::IsOffsetInScope((DebuggerScope *)this_00,offset);
        if (((bVar3) && (bVar3 = DebuggerScope::IsParamScope((DebuggerScope *)this_00), !bVar3)) &&
           ((this_00->indexedItemCount != 0xffffffff ||
            ((*(Type *)&(this_00->super_RecyclableObjectWalker).instance == DiagBlockScopeDirect &&
             (bVar3 = DebuggerScope::HasProperties((DebuggerScope *)this_00), bVar3)))))) {
          switch(*(Type *)&(this_00->super_RecyclableObjectWalker).instance) {
          case DiagWithScope:
            if (local_38->enumWithScopeAlso == true) {
              pRVar12 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e);
              pDVar16 = local_38;
              pDVar15 = (local_38->super_VariableWalkerBase).pFrame;
              RVar6 = DebuggerScope::GetLocation((DebuggerScope *)this_00);
              iVar7 = (*pDVar15->_vptr_DiagStackFrame[5])(pDVar15,(ulong)RVar6,1);
              RecyclableObjectWalker::RecyclableObjectWalker
                        (pRVar12,(ScriptContext *)CONCAT44(extraout_var_00,iVar5),
                         (Var)CONCAT44(extraout_var_02,iVar7));
              local_40 = pRVar12;
              JsUtil::
              List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Add(pDVar16->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&local_40);
              pp_Var14 = (pRVar12->super_IDiagObjectModelWalkerBase).
                         _vptr_IDiagObjectModelWalkerBase;
              goto LAB_007e8844;
            }
            goto LAB_007e8595;
          case DiagCatchScopeDirect:
          case DiagCatchScopeInObject:
            pRVar12 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
            pDVar16 = local_38;
            pSVar1 = (ScriptContext *)(local_38->super_VariableWalkerBase).pFrame;
            (pRVar12->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
                 (_func_int **)&PTR_Get_0137faa0;
            pRVar12->scriptContext = pSVar1;
            pRVar12->instance = this_00;
            local_40 = pRVar12;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(local_38->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&local_40);
            iVar7 = *(int *)(*(long *)((long)pRVar12->instance + 8) + 0x10);
            goto LAB_007e8847;
          case DiagCatchScopeInSlot:
          case DiagBlockScopeInSlot:
            pRVar12 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
            pSVar1 = (ScriptContext *)(local_38->super_VariableWalkerBase).pFrame;
            RVar6 = DebuggerScope::GetLocation((DebuggerScope *)this_00);
            iVar7 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x12])
                              (pSVar1,(ulong)RVar6);
            pRVar12->scriptContext = pSVar1;
            pRVar12->instance = (Var)CONCAT44(extraout_var_01,iVar7);
            pRVar12->originalInstance = (Var)0x0;
            *(undefined4 *)&pRVar12->pMembersList = 1;
            *(undefined2 *)((long)&pRVar12->pMembersList + 4) = 0;
            ppuVar13 = &PTR_Get_0137f9b0;
            break;
          case DiagBlockScopeDirect:
            pRVar12 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x30,alloc,0x35916e);
            pRVar12->scriptContext = (ScriptContext *)(local_38->super_VariableWalkerBase).pFrame;
            pRVar12->instance = (Var)0x0;
            pRVar12->originalInstance = (Var)0x0;
            *(undefined4 *)&pRVar12->pMembersList = 1;
            *(undefined2 *)((long)&pRVar12->pMembersList + 4) = 0;
            (pRVar12->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
                 (_func_int **)&PTR_Get_0137f960;
            pRVar12->innerArrayObjectWalker = this_00;
            goto LAB_007e8829;
          case DiagBlockScopeInObject:
            pRVar12 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
            pSVar1 = (ScriptContext *)(local_38->super_VariableWalkerBase).pFrame;
            RVar6 = DebuggerScope::GetLocation((DebuggerScope *)this_00);
            iVar7 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x12])
                              (pSVar1,(ulong)RVar6);
            pRVar12->scriptContext = pSVar1;
            pRVar12->instance = (Var)CONCAT44(extraout_var_03,iVar7);
            pRVar12->originalInstance = (Var)0x0;
            *(undefined4 *)&pRVar12->pMembersList = 1;
            *(undefined2 *)((long)&pRVar12->pMembersList + 4) = 0;
            ppuVar13 = local_70;
            break;
          default:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x3f0,"(false)","false");
            if (!bVar3) goto LAB_007e8871;
            *puVar8 = 0;
            goto LAB_007e8595;
          }
          (pRVar12->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
               (_func_int **)ppuVar13;
LAB_007e8829:
          pDVar16 = local_38;
          local_40 = pRVar12;
          JsUtil::
          List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(local_38->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&local_40);
          pp_Var14 = (pRVar12->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
LAB_007e8844:
          iVar7 = (*pp_Var14[1])(pRVar12);
LAB_007e8847:
          pDVar16->diagScopeVarCount = pDVar16->diagScopeVarCount + iVar7;
        }
        goto LAB_007e8595;
      }
    }
    local_38->scopeIsInitialized = true;
  }
  return local_38->diagScopeVarCount;
}

Assistant:

uint32 DiagScopeVariablesWalker::GetChildrenCount()
    {
        if (scopeIsInitialized)
        {
            return diagScopeVarCount;
        }
        Assert(pFrame);
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();

        if (pFBody->GetScopeObjectChain())
        {
            int bytecodeOffset = GetAdjustedByteCodeOffset();
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);
            pDiagScopeObjects = JsUtil::List<IDiagObjectModelWalkerBase *, ArenaAllocator>::New(arena);

            // Look for catch/with/block scopes which encompass current offset (skip block scopes as
            // they are only used for lookup within the RegSlotVariablesWalker).

            // Go the reverse way so that we find the innermost scope first;
            Js::ScopeObjectChain * pScopeObjectChain = pFBody->GetScopeObjectChain();
            for (int i = pScopeObjectChain->pScopeChain->Count() - 1 ; i >= 0; i--)
            {
                Js::DebuggerScope *debuggerScope = pScopeObjectChain->pScopeChain->Item(i);
                bool isScopeInRange = debuggerScope->IsOffsetInScope(bytecodeOffset);
                if (isScopeInRange
                    && !debuggerScope->IsParamScope()
                    && (debuggerScope->IsOwnScope() || (debuggerScope->scopeType == DiagBlockScopeDirect && debuggerScope->HasProperties())))
                {
                    switch (debuggerScope->scopeType)
                    {
                    case DiagWithScope:
                        {
                            if (enumWithScopeAlso)
                            {
                                RecyclableObjectWalker* recylableObjectWalker = Anew(arena, RecyclableObjectWalker, scriptContext,
                                    (Var)pFrame->GetRegValue(debuggerScope->GetLocation(), true));
                                pDiagScopeObjects->Add(recylableObjectWalker);
                                diagScopeVarCount += recylableObjectWalker->GetChildrenCount();
                            }
                        }
                        break;
                    case DiagCatchScopeDirect:
                    case DiagCatchScopeInObject:
                        {
                            CatchScopeWalker* catchScopeWalker = Anew(arena, CatchScopeWalker, pFrame, debuggerScope);
                            pDiagScopeObjects->Add(catchScopeWalker);
                            diagScopeVarCount += catchScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagCatchScopeInSlot:
                    case DiagBlockScopeInSlot:
                        {
                            SlotArrayVariablesWalker* blockScopeWalker = Anew(arena, SlotArrayVariablesWalker, pFrame,
                                (Var)pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(blockScopeWalker);
                            diagScopeVarCount += blockScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeDirect:
                        {
                            RegSlotVariablesWalker *pObjWalker = Anew(arena, RegSlotVariablesWalker, pFrame, debuggerScope, UIGroupType_InnerScope);
                            pDiagScopeObjects->Add(pObjWalker);
                            diagScopeVarCount += pObjWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeInObject:
                        {
                            ObjectVariablesWalker* objectVariablesWalker = Anew(arena, ObjectVariablesWalker, pFrame, pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(objectVariablesWalker);
                            diagScopeVarCount += objectVariablesWalker->GetChildrenCount();
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }
        }
        scopeIsInitialized = true;
        return diagScopeVarCount;
    }